

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_iq4_nl(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *x;
  long in_RCX;
  uint8_t *in_RDX;
  uint8_t *unaff_RBX;
  float *in_RSI;
  float *in_RDI;
  undefined8 in_R8;
  int8_t *unaff_R14;
  float *unaff_R15;
  int unaff_retaddr;
  float *qw;
  int ibl;
  block_iq4_nl *iq4;
  int64_t row;
  float scale;
  uint8_t *unused_l;
  uint16_t unused_h;
  float weight [32];
  uint8_t L [32];
  char *qrow;
  int64_t nblock;
  int local_124;
  long local_118;
  uint16_t *in_stack_ffffffffffffffa0;
  uint8_t *in_stack_ffffffffffffffa8;
  float *scales;
  
  if (in_RCX % 0x20 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0x124d,"GGML_ASSERT(%s) failed","n_per_row%QK4_NL == 0");
  }
  x = (float *)(in_RCX / 0x20);
  scales = in_RSI;
  for (local_118 = 0; local_118 < (long)in_RDX; local_118 = local_118 + 1) {
    for (local_124 = 0; (long)local_124 < (long)x; local_124 = local_124 + 1) {
      quantize_row_iq4_nl_impl
                ((int)((ulong)in_R8 >> 0x20),(int)in_R8,x,(ggml_fp16_t *)in_RSI,
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDX,scales,in_RDI,unaff_RBX,
                 unaff_R14,unaff_R15,unaff_retaddr);
    }
    in_RDI = in_RDI + in_RCX;
    in_RSI = (float *)((long)x * 0x12 + (long)in_RSI);
  }
  return (long)in_RDX * (long)x * 0x12;
}

Assistant:

size_t quantize_iq4_nl(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK4_NL == 0);
    int64_t nblock = n_per_row/QK4_NL;
    char * qrow = (char *)dst;
    uint8_t L[QK4_NL];
    float weight[QK4_NL];
    uint16_t unused_h;
    uint8_t * unused_l = NULL;
    float scale;
    for (int64_t row = 0; row < nrow; ++row) {
        block_iq4_nl * iq4 = (block_iq4_nl *)qrow;
        for (int ibl = 0; ibl < nblock; ++ibl) {
            const float * qw = quant_weights ? quant_weights + QK4_NL*ibl : NULL;
            quantize_row_iq4_nl_impl(QK4_NL, 32, src + QK4_NL*ibl, &iq4[ibl].d, iq4[ibl].qs, &unused_h, unused_l,
                    &scale, weight, L, kvalues_iq4nl, qw, 7);
        }
        src += n_per_row;
        qrow += nblock*sizeof(block_iq4_nl);
    }
    return nrow * nblock * sizeof(block_iq4_nl);
}